

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O0

void __thiscall
luna::CodeGenerateVisitor::Visit(CodeGenerateVisitor *this,TableNameField *field,void *data)

{
  int line;
  int iVar1;
  Instruction line_00;
  Function *this_00;
  CodeGenerateVisitor *in_RDX;
  CodeGenerateVisitor *in_RSI;
  CodeGenerateVisitor *in_RDI;
  Instruction instruction;
  int key_register;
  int key_index;
  Function *function;
  int table_register;
  TableFieldData *field_data;
  OpType in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar2;
  
  uVar2 = *(undefined4 *)&(in_RDX->super_Visitor)._vptr_Visitor;
  this_00 = GetCurrentFunction(in_RDI);
  line = Function::AddConstString
                   (this_00,(String *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8))
  ;
  iVar1 = GenerateRegisterId(in_RSI);
  line_00 = Instruction::ABxCode(in_stack_ffffffffffffffc0,(int)((ulong)in_RDI >> 0x20),(int)in_RDI)
  ;
  Function::AddInstruction
            ((Function *)CONCAT44(line,iVar1),(Instruction)(uint)((ulong)this_00 >> 0x20),
             line_00.opcode_);
  SetTableFieldValue<luna::TableNameField>
            (in_RDX,(TableNameField *)CONCAT44(uVar2,in_stack_ffffffffffffffd8),
             (int)((ulong)this_00 >> 0x20),(int)this_00,line);
  return;
}

Assistant:

void CodeGenerateVisitor::Visit(TableNameField *field, void *data)
    {
        auto field_data = static_cast<TableFieldData *>(data);
        auto table_register = field_data->table_register_;

        // Load key
        auto function = GetCurrentFunction();
        auto key_index = function->AddConstString(field->name_.str_);
        auto key_register = GenerateRegisterId();
        auto instruction = Instruction::ABxCode(OpType_LoadConst, key_register, key_index);
        function->AddInstruction(instruction, field->name_.line_);

        SetTableFieldValue(field, table_register, key_register, field->name_.line_);
    }